

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O2

string * __thiscall
LTAircraft::RelativePositionText_abi_cxx11_(string *__return_storage_ptr__,LTAircraft *this)

{
  bool bVar1;
  float fVar2;
  string local_d8;
  vectorTy vecRel;
  char out [100];
  
  if ((NAN((this->nearestAirportPos)._lat)) ||
     (bVar1 = CheckEverySoOften(&this->lastNearestAirportCheck,180.0), bVar1)) {
    fVar2 = DataRefs::GetMiscNetwTime(&dataRefs);
    this->lastNearestAirportCheck = fVar2;
    (this->nearestAirportPos)._lat = NAN;
    (this->nearestAirportPos)._lon = NAN;
    GetNearestAirportId_abi_cxx11_((string *)out,&this->ppos,&this->nearestAirportPos);
    std::__cxx11::string::operator=((string *)&this->nearestAirport,(string *)out);
    std::__cxx11::string::~string((string *)out);
    if (NAN((this->nearestAirportPos)._lat)) {
      positionTy::operator_cast_to_string(__return_storage_ptr__,&this->ppos);
      return __return_storage_ptr__;
    }
  }
  CoordVectorBetween(&vecRel,&this->nearestAirportPos,&this->ppos);
  HeadingText_abi_cxx11_(&local_d8,vecRel.angle);
  snprintf(out,100,"%.1fnm %s of %s",SUB84(vecRel.dist / 1852.0,0),local_d8._M_dataplus._M_p,
           (this->nearestAirport)._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,out,(allocator<char> *)&local_d8);
  return __return_storage_ptr__;
}

Assistant:

std::string LTAircraft::RelativePositionText ()
{
    // find/update the nearest airport when needed or
    if (std::isnan(nearestAirportPos.lat()) ||
        CheckEverySoOften(lastNearestAirportCheck, ACI_NEAR_AIRPRT_PERIOD))
    {
        lastNearestAirportCheck = dataRefs.GetMiscNetwTime();
    
        // Find the nearest airport
        nearestAirportPos.lat() = NAN;
        nearestAirportPos.lon() = NAN;
        nearestAirport = GetNearestAirportId(GetPPos(), &nearestAirportPos);
        if (std::isnan(nearestAirportPos.lat())) {   // no airport found?
            return std::string(GetPPos());
        }
    }
    
    // determine bearing from airport to position
    vectorTy vecRel = nearestAirportPos.between(GetPPos());
    
    // put together a nice string
    char out[100];
    snprintf(out, sizeof(out), "%.1fnm %s of %s",
             vecRel.dist / M_per_NM, HeadingText(vecRel.angle).c_str(), nearestAirport.c_str());
    return std::string(out);
}